

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_allocator.hpp
# Opt level: O0

_Rb_tree_node<tcmalloc::Span_*> * __thiscall
tcmalloc::FixedAllocator<std::_Rb_tree_node<tcmalloc::Span_*>_>::AllocFromArea
          (FixedAllocator<std::_Rb_tree_node<tcmalloc::Span_*>_> *this)

{
  _Rb_tree_node<tcmalloc::Span_*> *p_Var1;
  char *pcVar2;
  void *result;
  void *ptr;
  FixedAllocator<std::_Rb_tree_node<tcmalloc::Span_*>_> *this_local;
  
  if (this->area_free_ < 0x28) {
    pcVar2 = (char *)SystemAlloc(0x8000000);
    if (pcVar2 == (char *)0xffffffffffffffff) {
      return (_Rb_tree_node<tcmalloc::Span_*> *)0x0;
    }
    this->area_ = pcVar2;
    this->area_free_ = 0x8000000;
  }
  p_Var1 = (_Rb_tree_node<tcmalloc::Span_*> *)this->area_;
  this->area_ = this->area_ + 0x28;
  this->area_free_ = this->area_free_ - 0x28;
  return p_Var1;
}

Assistant:

T *AllocFromArea() {
        if (area_free_ < sizeof(T)) {
            void *ptr = SystemAlloc(areaSize_);
            if (ptr == (void *) (-1)) {
                return nullptr;
            }
            area_ = (char *) ptr;
            area_free_ = areaSize_;
        }
        void *result = area_;
        area_ += sizeof(T);
        area_free_ -= sizeof(T);
        return reinterpret_cast<T *>(result);
    }